

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O1

void __thiscall CP::vector<int>::uniq(vector<int> *this)

{
  int iVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  int *piVar4;
  size_t sVar5;
  unsigned_long __tmp;
  __node_base_ptr p_Var6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  ulong uVar9;
  vector<int> tmp;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> s;
  vector<int> local_80;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_68;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  local_80.mData = (int *)operator_new__(4);
  *local_80.mData = 0;
  local_80.mCap = 1;
  local_80.mSize = 0;
  uVar7 = this->mSize;
  if (uVar7 != 0) {
    uVar9 = 0;
    do {
      iVar1 = this->mData[uVar9];
      p_Var2 = local_60._M_buckets[(ulong)(long)iVar1 % local_60._M_bucket_count];
      p_Var6 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var6 = p_Var2, p_Var8 = p_Var2->_M_nxt, iVar1 != *(int *)&p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var6 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % local_60._M_bucket_count !=
               (ulong)(long)iVar1 % local_60._M_bucket_count) ||
             (p_Var6 = p_Var8, p_Var8 = p_Var3, iVar1 == *(int *)&p_Var3[1]._M_nxt))
          goto LAB_001014d9;
        }
        p_Var6 = (__node_base_ptr)0x0;
      }
LAB_001014d9:
      if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
        local_68 = &local_60;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_60,this->mData + uVar9,&local_68);
        insert(&local_80,local_80.mData + local_80.mSize,this->mData + uVar9);
      }
      uVar9 = uVar9 + 1;
      uVar7 = this->mSize;
    } while (uVar9 < uVar7);
  }
  piVar4 = this->mData;
  this->mData = local_80.mData;
  this->mSize = local_80.mSize;
  sVar5 = this->mCap;
  this->mCap = local_80.mCap;
  local_80.mData = piVar4;
  local_80.mCap = sVar5;
  local_80.mSize = uVar7;
  if (piVar4 != (int *)0x0) {
    operator_delete__(piVar4);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return;
}

Assistant:

void CP::vector<T>::uniq() {
  //do someting here
  std::unordered_set<T> s;
  CP::vector<T> tmp;
  for (int i = 0; i < mSize; ++i) {
    if (s.find(mData[i]) == s.end()) {
      s.insert(mData[i]);
      tmp.push_back(mData[i]);
    }
  }
  std::swap(mData, tmp.mData);
  std::swap(mSize, tmp.mSize);
  std::swap(mCap, tmp.mCap);
}